

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

bool __thiscall choc::value::Type::Object::operator==(Object *this,Object *other)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  bool bVar1;
  MemberNameAndType *pMVar2;
  MemberNameAndType *pMVar3;
  uint local_44;
  uint32_t i;
  Object *other_local;
  Object *this_local;
  
  __x._M_len = (this->className)._M_len;
  __x._M_str = (this->className)._M_str;
  __y._M_len = (other->className)._M_len;
  __y._M_str = (other->className)._M_str;
  bVar1 = std::operator!=(__x,__y);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->members).size == (other->members).size) {
    for (local_44 = 0; local_44 < (this->members).size; local_44 = local_44 + 1) {
      pMVar2 = AllocatedVector<choc::value::MemberNameAndType>::operator[](&this->members,local_44);
      __x_00._M_len = (pMVar2->name)._M_len;
      __x_00._M_str = (pMVar2->name)._M_str;
      pMVar2 = AllocatedVector<choc::value::MemberNameAndType>::operator[](&other->members,local_44)
      ;
      __y_00._M_len = (pMVar2->name)._M_len;
      __y_00._M_str = (pMVar2->name)._M_str;
      bVar1 = std::operator!=(__x_00,__y_00);
      if (bVar1) {
        return false;
      }
      pMVar2 = AllocatedVector<choc::value::MemberNameAndType>::operator[](&this->members,local_44);
      pMVar3 = AllocatedVector<choc::value::MemberNameAndType>::operator[](&other->members,local_44)
      ;
      bVar1 = Type::operator!=(&pMVar2->type,&pMVar3->type);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator== (const Object& other) const
    {
        if (className != other.className)
            return false;

        if (members.size != other.members.size)
            return false;

        for (uint32_t i = 0; i < members.size; ++i)
            if (members[i].name != other.members[i].name
                    || members[i].type != other.members[i].type)
                return false;

        return true;
    }